

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O0

void __thiscall Commander::printHelp(Commander *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  pointer ppVar4;
  string local_50 [32];
  Command *local_30;
  Command *cmd;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>
  local_18;
  iterator itr;
  Commander *this_local;
  
  itr._M_node = (_Base_ptr)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Available commands: ");
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
          ::size(&this->cmds);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>
  ::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
             ::begin(&this->cmds);
  local_18._M_node = local_20;
  while( true ) {
    cmd = (Command *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
          ::end(&this->cmds);
    bVar1 = std::operator!=(&local_18,(_Self *)&cmd);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>
             ::operator->(&local_18);
    local_30 = ppVar4->second;
    if (local_30 != (Command *)0x0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>
               ::operator->(&local_18);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)ppVar4);
      poVar2 = std::operator<<(poVar2," \t- ");
      (*local_30->_vptr_Command[2])();
      poVar2 = std::operator<<(poVar2,local_50);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_50);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Commander::printHelp()
{
    std::cout << "Available commands: " << cmds.size() << endl;
    std::map<std::string, Command*>::iterator itr;
    for (itr = cmds.begin(); itr != cmds.end(); ++itr) {
        Command *cmd = itr->second;
        if (cmd == NULL) continue;
        std::cout << itr->first << " \t- " << cmd->getDescription() << endl;
    }
}